

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkCanBeSimplified(CheckerVisitor *this,TerExpr *expr)

{
  Expr *pEVar1;
  long lVar2;
  bool bVar3;
  Node *lhs;
  Node *rhs;
  Expr *e;
  int32_t local_20;
  int32_t local_1c;
  
  if ((this->effectsOnly == false) && (pEVar1 = expr->_a, (pEVar1->super_Node)._op == TO_NE)) {
    e = (Expr *)pEVar1[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    if (((e->super_Node)._op == TO_LITERAL) && (*(int *)&(e->super_Node).field_0x1c == 4)) {
      e = *(Expr **)&pEVar1[1].super_Node._coordinates;
      if (e == (Expr *)0x0) {
        return;
      }
    }
    else {
      lVar2 = *(long *)&pEVar1[1].super_Node._coordinates;
      if (*(int *)(lVar2 + 0x18) != 0x39) {
        return;
      }
      if (*(int *)(lVar2 + 0x1c) != 4) {
        return;
      }
    }
    if (((expr->_c->super_Node)._op == TO_LITERAL) &&
       (*(int *)&(expr->_c->super_Node).field_0x1c == 4)) {
      lhs = &maybeEval(this,e,&local_20,false)->super_Node;
      rhs = &maybeEval(this,expr->_b,&local_1c,false)->super_Node;
      bVar3 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
      if (bVar3) {
        report(this,(Node *)expr,0x79);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanBeSimplified(const TerExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *cond = expr->a();
  const Expr *checkee = nullptr;


  if (cond->op() == TO_NE) {
    const BinExpr *b = static_cast<const BinExpr *>(cond);

    if (b->lhs()->op() == TO_LITERAL && b->lhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->rhs();
    else if (b->rhs()->op() == TO_LITERAL && b->rhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->lhs();
  }

  if (!checkee)
    return;

  if (expr->c()->op() != TO_LITERAL || expr->c()->asLiteral()->kind() != LK_NULL)
    return;

  checkee = maybeEval(checkee);
  const Expr *t = maybeEval(expr->b());

  if (_equalChecker.check(checkee, t)) {
    report(expr, DiagnosticsId::DI_CAN_BE_SIMPLIFIED);
  }
}